

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylnsymmat.cpp
# Opt level: O1

void __thiscall
TPZSkylNSymMatrix<std::complex<float>_>::MultAdd
          (TPZSkylNSymMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *x,
          TPZFMatrix<std::complex<float>_> *y,TPZFMatrix<std::complex<float>_> *z,
          complex<float> alpha,complex<float> beta,int opt)

{
  _ComplexT _Var1;
  long lVar2;
  long lVar3;
  complex<float> **ppcVar4;
  ostream *poVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  undefined8 *puVar12;
  undefined8 *puVar13;
  long lVar14;
  complex<float> *pcVar15;
  float in_XMM0_Da;
  float in_XMM0_Db;
  undefined8 uVar16;
  undefined8 uVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  iVar9 = (int)alpha._M_value;
  iVar10 = iVar9;
  if (((iVar9 == 0) &&
      ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
       (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) ||
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow !=
      (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZSkylNSymMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ," <matrixs with incompatible dimensions>");
  }
  lVar2 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow != lVar2) ||
     ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol !=
      (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol)) {
    (*(z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0xe])
              (z,lVar2,(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol);
  }
  lVar2 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if (((lVar2 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol) ||
      (lVar2 != (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol)) ||
     ((lVar2 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow,
      lVar2 != (y->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow ||
      (lVar2 != (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow)))) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x.Cols = ",9);
    poVar5 = std::ostream::_M_insert<long>((long)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," y.Cols()",9);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," z.Cols() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," x.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," y.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," z.Rows() ",10);
    poVar5 = std::ostream::_M_insert<long>((long)poVar5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    TPZMatrix<std::complex<float>_>::Error
              ("virtual void TPZSkylNSymMatrix<std::complex<float>>::MultAdd(const TPZFMatrix<TVar> &, const TPZFMatrix<TVar> &, TPZFMatrix<TVar> &, const TVar, const TVar, const int) const [TVar = std::complex<float>]"
               ," incompatible dimensions\n");
  }
  TPZMatrix<std::complex<float>_>::PrepareZ
            (&this->super_TPZMatrix<std::complex<float>_>,y,z,
             (complex<float>)(alpha._M_value & 0xffffffff),iVar10);
  lVar2 = (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
  if (0 < lVar2) {
    lVar3 = (this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
    lVar8 = 0;
    do {
      if (0 < lVar3) {
        lVar7 = 0;
        do {
          ppcVar4 = (this->fElem).fStore;
          lVar11 = (long)(int)((ulong)((long)ppcVar4[lVar7 + 1] - (long)ppcVar4[lVar7]) >> 3);
          lVar14 = lVar7 - lVar11;
          pcVar15 = x->fElem +
                    (x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar8 +
                    lVar14;
          puVar12 = *(undefined8 **)
                     ((this->fStorage).fExtAlloc[(ulong)(iVar9 == 0) * 4 + -0xb]._M_value +
                     lVar7 * 8);
          puVar13 = puVar12 + lVar11;
          fVar23 = 0.0;
          fVar24 = 0.0;
          while( true ) {
            pcVar15 = pcVar15 + 1;
            puVar13 = puVar13 + -1;
            if (puVar13 <= puVar12) break;
            fVar19 = (float)*puVar13;
            fVar22 = (float)((ulong)*puVar13 >> 0x20);
            _Var1 = pcVar15->_M_value;
            fVar20 = (float)(_Var1 >> 0x20);
            fVar18 = (float)_Var1 * fVar19 - fVar20 * fVar22;
            fVar21 = fVar19 * fVar20 + fVar22 * (float)_Var1;
            uVar16 = CONCAT44(fVar21,fVar18);
            if ((NAN(fVar18)) && (uVar16 = CONCAT44(fVar21,fVar18), NAN(fVar21))) {
              uVar16 = __mulsc3(fVar19,fVar22,_Var1,fVar20);
            }
            fVar23 = fVar23 + (float)uVar16;
            fVar24 = fVar24 + (float)((ulong)uVar16 >> 0x20);
          }
          if (puVar13 == puVar12) {
            _Var1 = (this->fElem).fStore[lVar7]->_M_value;
            fVar19 = (float)_Var1;
            fVar22 = (float)(_Var1 >> 0x20);
            _Var1 = pcVar15->_M_value;
            fVar20 = (float)(_Var1 >> 0x20);
            fVar18 = (float)_Var1 * fVar19 - fVar20 * fVar22;
            fVar21 = fVar19 * fVar20 + fVar22 * (float)_Var1;
            uVar16 = CONCAT44(fVar21,fVar18);
            if ((NAN(fVar18)) && (uVar16 = CONCAT44(fVar21,fVar18), NAN(fVar21))) {
              uVar16 = __mulsc3(fVar19,fVar22,_Var1,fVar20);
            }
            fVar23 = fVar23 + (float)uVar16;
            fVar24 = fVar24 + (float)((ulong)uVar16 >> 0x20);
          }
          fVar19 = in_XMM0_Da * fVar23 - in_XMM0_Db * fVar24;
          fVar22 = in_XMM0_Da * fVar24 + in_XMM0_Db * fVar23;
          uVar16 = CONCAT44(fVar22,fVar19);
          if ((NAN(fVar19)) && (uVar16 = CONCAT44(fVar22,fVar19), NAN(fVar22))) {
            uVar16 = __mulsc3(fVar23,fVar24,CONCAT44(in_XMM0_Db,in_XMM0_Da),in_XMM0_Db);
          }
          if (((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar7) ||
             ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          lVar6 = (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar8;
          _Var1 = z->fElem[lVar6 + lVar7]._M_value;
          z->fElem[lVar6 + lVar7]._M_value =
               CONCAT44((float)((ulong)uVar16 >> 0x20) + (float)(_Var1 >> 0x20),
                        (float)uVar16 + (float)_Var1);
          if (((lVar14 < -1) ||
              ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow <= lVar14 + 1))
             || ((z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<std::complex<float>_>::Error
                      ("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          puVar13 = *(undefined8 **)
                     ((this->fStorage).fExtAlloc[(ulong)(iVar9 != 0) * 4 + -0xb]._M_value +
                     lVar7 * 8);
          puVar12 = puVar13 + lVar11 + -1;
          if (puVar13 < puVar12) {
            _Var1 = x->fElem[(x->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow *
                             lVar8 + lVar7]._M_value;
            fVar23 = (float)(_Var1 >> 0x20);
            pcVar15 = z->fElem +
                      (z->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow * lVar8 +
                      lVar14 + 1;
            do {
              uVar16 = *puVar12;
              fVar22 = (float)((ulong)uVar16 >> 0x20);
              fVar24 = (float)uVar16 * in_XMM0_Da - fVar22 * in_XMM0_Db;
              fVar19 = in_XMM0_Da * fVar22 + in_XMM0_Db * (float)uVar16;
              uVar17 = CONCAT44(fVar19,fVar24);
              if ((NAN(fVar24)) && (uVar17 = CONCAT44(fVar19,fVar24), NAN(fVar19))) {
                uVar17 = __mulsc3(in_XMM0_Da,in_XMM0_Db,uVar16,fVar22);
              }
              fVar19 = (float)((ulong)uVar17 >> 0x20);
              fVar24 = (float)uVar17;
              fVar18 = fVar24 * (float)_Var1 - fVar23 * fVar19;
              fVar22 = (float)_Var1 * fVar19 + fVar24 * fVar23;
              uVar16 = CONCAT44(fVar22,fVar18);
              if ((NAN(fVar18)) && (uVar16 = CONCAT44(fVar22,fVar18), NAN(fVar22))) {
                uVar16 = __mulsc3(fVar24,fVar19,_Var1,fVar23);
              }
              pcVar15->_M_value =
                   CONCAT44((float)(pcVar15->_M_value >> 0x20) + (float)((ulong)uVar16 >> 0x20),
                            (float)pcVar15->_M_value + (float)uVar16);
              pcVar15 = pcVar15 + 1;
              puVar12 = puVar12 + -1;
            } while (puVar13 < puVar12);
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != lVar3);
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != lVar2);
  }
  return;
}

Assistant:

void TPZSkylNSymMatrix<TVar>::MultAdd(const TPZFMatrix<TVar> &x, const TPZFMatrix<TVar> &y,
  TPZFMatrix<TVar> &z, const TVar alpha, const TVar beta, const int opt)const
{
  // Computes z = beta * y + alpha * opt(this)*x
  // z and x cannot overlap in memory
  if ((!opt && this->Cols() != x.Rows()) || this->Rows() != x.Rows())
    TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,
    " <matrixs with incompatible dimensions>");
  if (z.Rows() != x.Rows() || z.Cols() != x.Cols())
    z.Redim(x.Rows(), x.Cols());
  if (x.Cols() != y.Cols() || x.Cols() != z.Cols() || x.Rows() != y.Rows()
    || x.Rows() != z.Rows())
  {
    cout << "x.Cols = " << x.Cols() << " y.Cols()" << y.Cols()
        << " z.Cols() " << z.Cols() << " x.Rows() " << x.Rows()
        << " y.Rows() " << y.Rows() << " z.Rows() " << z.Rows() << endl;
    TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__, " incompatible dimensions\n");
  }
  this->PrepareZ(y, z, beta, opt);
  int64_t rows = this->Rows();
  int64_t xcols = x.Cols();
  int64_t ic, r;
  for (ic = 0; ic < xcols; ic++)
  {
    for (r = 0; r < rows; r++)
    {
      int64_t offset = Size(r);
      TVar val = 0.;
      const TVar *p = &x.g((r - offset + 1), ic);
        TVar *diag, *diaglast;
        if (opt == 0)
        {
            diag = fElemb[r] + offset - 1;
            diaglast = fElemb[r];
        }
        else
        {
            diag = fElem[r] + offset - 1;
            diaglast = fElem[r];
        }
      while (diag > diaglast)
      {
        val += *diag--**p;
        p ++;
      }
      if (diag == diaglast)
      {
        diag = fElem[r];
        val += *diag * *p;
      }
      z(r, ic) += val * alpha;
      TVar *zp = &z((r - offset + 1), ic);
      val = x.g(r, ic);
        if(opt == 0)
        {
          diag = fElem[r] + offset - 1;
          diaglast = fElem[r];
        }
        else
        {
            diag = fElemb[r] + offset - 1;
            diaglast = fElemb[r];
        }
      while (diag > diaglast)
      {
        *zp += alpha * *diag--*val;
        zp ++;
      }
      //z.Print("z");
    }
  }
}